

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::LoadNextShuffleVectors(Alice *this)

{
  pointer *ppvVar1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_00;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_01;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_02;
  long lVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_108 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  U;
  undefined1 local_c0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  V;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  W;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  X;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Y;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Z;
  long temp;
  
  if (LoadNextShuffleVectors()::upin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::upin);
    if (iVar3 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::upin,"../randoms/alice/U_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::upin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::upin);
    }
  }
  if (LoadNextShuffleVectors()::udin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::udin);
    if (iVar3 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::udin,"../randoms/alice/U_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::udin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::udin);
    }
  }
  if (LoadNextShuffleVectors()::rpin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rpin);
    if (iVar3 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rpin,"../randoms/alice/R_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rpin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rpin);
    }
  }
  if (LoadNextShuffleVectors()::rdin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rdin);
    if (iVar3 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rdin,"../randoms/alice/R_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rdin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rdin);
    }
  }
  if (LoadNextShuffleVectors()::pipin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pipin);
    if (iVar3 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pipin,"../randoms/alice/Pi_diff_R_PB_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pipin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pipin);
    }
  }
  if (LoadNextShuffleVectors()::pidin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pidin);
    if (iVar3 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pidin,"../randoms/alice/Pi_diff_R_DB_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pidin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pidin);
    }
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_108,(long)(this->super_Party).n_p,(allocator_type *)local_c0);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_c0,(long)(this->super_Party).n_p,
           (allocator_type *)
           &V.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&V.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_p,
           (allocator_type *)
           &W.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&W.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &X.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&X.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Y.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Y.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Z.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  U.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&(this->super_Party).U_P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *)U.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &(this->super_Party).U_D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(this_00);
  this_01 = &(this->super_Party).R_P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(this_01);
  this_02 = &(this->super_Party).R_D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(this_02);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&this->Pi_P_diff_R_PB_R_PA);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&this->Pi_D_diff_R_DB_R_DA);
  ppvVar1 = &Z.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (lVar2 = 0; lVar2 < (this->super_Party).n_p; lVar2 = lVar2 + 1) {
    iVar3 = 5;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::upin);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)((long)local_108 + lVar2 * 0x18),
                 (value_type *)ppvVar1);
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::rpin);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)((long)local_c0 + lVar2 * 0x18),
                 (value_type *)ppvVar1);
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::pipin);
      std::vector<long,_std::allocator<long>_>::push_back
                (V.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2,(value_type *)ppvVar1);
    }
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)U.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_108,
             U.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_01,local_c0,
             V.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_P_diff_R_PB_R_PA,
             V.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             W.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppvVar1 = &Z.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (lVar2 = 0; lVar2 < (this->super_Party).n_d; lVar2 = lVar2 + 1) {
    iVar3 = 2;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::udin);
      std::vector<long,_std::allocator<long>_>::push_back
                (W.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2,(value_type *)ppvVar1);
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::rdin);
      std::vector<long,_std::allocator<long>_>::push_back
                (X.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2,(value_type *)ppvVar1);
      std::istream::_M_extract<long>((long *)LoadNextShuffleVectors()::pidin);
      std::vector<long,_std::allocator<long>_>::push_back
                (Y.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar2,(value_type *)ppvVar1);
    }
  }
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_00,
             W.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             X.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)this_02,
             X.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             Y.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_D_diff_R_DB_R_DA,
             Y.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             Z.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Y.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&X.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&W.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&V.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_c0);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_108);
  return;
}

Assistant:

void Alice::LoadNextShuffleVectors()
{
    static std::ifstream upin("../randoms/alice/U_PA.txt");
    static std::ifstream udin("../randoms/alice/U_DA.txt");
    static std::ifstream rpin("../randoms/alice/R_PA.txt");
    static std::ifstream rdin("../randoms/alice/R_DA.txt");
    static std::ifstream pipin("../randoms/alice/Pi_diff_R_PB_PA.txt");
    static std::ifstream pidin("../randoms/alice/Pi_diff_R_DB_DA.txt");
    std::vector<std::vector<long>> U(n_p);
    std::vector<std::vector<long>> V(n_p);
    std::vector<std::vector<long>> W(n_p);
    std::vector<std::vector<long>> X(n_d);
    std::vector<std::vector<long>> Y(n_d);
    std::vector<std::vector<long>> Z(n_d);
    long temp;
    U_P.clear();
    U_D.clear();
    R_P.clear();
    R_D.clear();
    Pi_P_diff_R_PB_R_PA.clear();
    Pi_D_diff_R_DB_R_DA.clear();
    for (int i = 0; i < n_p; i++)
    {
        for (int j = 0; j < 5; j++)
        {
            upin >> temp;
            U[i].push_back(temp);
            rpin >> temp;
            V[i].push_back(temp);
            pipin >> temp;
            W[i].push_back(temp);
        }
    }
    U_P.assign(U.begin(), U.end());
    R_P.assign(V.begin(), V.end());
    Pi_P_diff_R_PB_R_PA.assign(W.begin(), W.end());
    for (int i = 0; i < n_d; i++)
    {
        for (int j = 0; j < 2; j++)
        {
            udin >> temp;
            X[i].push_back(temp);
            rdin >> temp;
            Y[i].push_back(temp);
            pidin >> temp;
            Z[i].push_back(temp);
        }
    }
    U_D.assign(X.begin(), X.end());
    R_D.assign(Y.begin(), Y.end());
    Pi_D_diff_R_DB_R_DA.assign(Z.begin(), Z.end());
}